

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

int stumpless_trace_log_str
              (stumpless_target *target,int priority,char *file,int line,char *func,char *message)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  stumpless_entry *psVar4;
  stumpless_entry *result;
  char *message_local;
  char *func_local;
  int line_local;
  char *file_local;
  int priority_local;
  stumpless_target *target_local;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    return -1;
  }
  lVar3 = __tls_get_addr(&PTR_00120fb0);
  if ((*(byte *)(lVar3 + 0x268) & 1) == 0) {
    lVar3 = __tls_get_addr(&PTR_00120fb0);
    psVar4 = stumpless_load_entry_str
                       ((stumpless_entry *)(lVar3 + 0x270),STUMPLESS_FACILITY_USER,
                        STUMPLESS_SEVERITY_INFO,(char *)0x0,(char *)0x0,message);
    if (psVar4 == (stumpless_entry *)0x0) {
      return -1;
    }
    psVar4 = add_trace_element();
    if (psVar4 == (stumpless_entry *)0x0) {
      lVar3 = __tls_get_addr(&PTR_00120fb0);
      unchecked_unload_entry((stumpless_entry *)(lVar3 + 0x270));
      return -1;
    }
    lVar3 = __tls_get_addr(&PTR_00120fb0);
    *(undefined1 *)(lVar3 + 0x268) = 1;
  }
  else {
    lVar3 = __tls_get_addr(&PTR_00120fb0);
    psVar4 = stumpless_set_entry_message_str((stumpless_entry *)(lVar3 + 0x270),message);
    if (psVar4 == (stumpless_entry *)0x0) {
      return -1;
    }
  }
  lVar3 = __tls_get_addr(&PTR_00120fb0);
  *(int *)(lVar3 + 0x410) = priority;
  lVar3 = __tls_get_addr(&PTR_00120fb0);
  memcpy((void *)(lVar3 + 0x414),target->default_app_name,target->default_app_name_length);
  sVar1 = target->default_app_name_length;
  lVar3 = __tls_get_addr(&PTR_00120fb0);
  *(size_t *)(lVar3 + 0x448) = sVar1;
  lVar3 = __tls_get_addr(&PTR_00120fb0);
  memcpy((void *)(lVar3 + 0x460),target->default_msgid,target->default_msgid_length);
  sVar1 = target->default_msgid_length;
  lVar3 = __tls_get_addr(&PTR_00120fb0);
  *(size_t *)(lVar3 + 0x488) = sVar1;
  lVar3 = __tls_get_addr(&PTR_00120fb0);
  iVar2 = stumpless_trace_entry(target,(stumpless_entry *)(lVar3 + 0x270),file,line,func);
  return iVar2;
}

Assistant:

int
stumpless_trace_log_str( struct stumpless_target *target,
                         int priority,
                         const char *file,
                         int line,
                         const char *func,
                         const char *message ) {
  const struct stumpless_entry *result;

  VALIDATE_ARG_NOT_NULL_INT_RETURN( target );

  if( unlikely( !cached_trace_valid ) ) {
    result = stumpless_load_entry_str( &cached_trace,
                                       STUMPLESS_FACILITY_USER,
                                       STUMPLESS_SEVERITY_INFO,
                                       NULL,
                                       NULL,
                                       message );
    if( unlikely( !result ) ) {
      return -1;
    }

    if( !add_trace_element(  ) ) {
      unchecked_unload_entry( &cached_trace );
      return -1;
    }

    cached_trace_valid = true;

  } else {
    result = stumpless_set_entry_message_str( &cached_trace,
                                              message );
    if( unlikely( !result ) ) {
      return -1;
    }
  }

  // we don't need to lock the cached entry since it is thread-local
  cached_trace.prival = priority;
  memcpy( cached_trace.app_name,
          target->default_app_name,
          target->default_app_name_length );
  cached_trace.app_name_length = target->default_app_name_length;
  memcpy( cached_trace.msgid,
          target->default_msgid,
          target->default_msgid_length );
  cached_trace.msgid_length = target->default_msgid_length;

  return stumpless_trace_entry( target, &cached_trace, file, line, func );
}